

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__tcp_listen(uv_tcp_t *tcp,int backlog,uv_connection_cb cb)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  
  if (tcp->delayed_error != 0) {
    return tcp->delayed_error;
  }
  iVar2 = 0;
  if ((tcp->io_watcher).fd == -1) {
    iVar2 = new_socket(tcp,2,0);
  }
  if (iVar2 == 0) {
    iVar2 = listen((tcp->io_watcher).fd,backlog);
    if (iVar2 == 0) {
      tcp->connection_cb = cb;
      pbVar1 = (byte *)((long)&tcp->flags + 1);
      *pbVar1 = *pbVar1 | 0x20;
      (tcp->io_watcher).cb = uv__server_io;
      uv__io_start(tcp->loop,&tcp->io_watcher,1);
      iVar2 = 0;
    }
    else {
      piVar3 = __errno_location();
      iVar2 = -*piVar3;
    }
  }
  return iVar2;
}

Assistant:

int uv__tcp_listen(uv_tcp_t* tcp, int backlog, uv_connection_cb cb) {
  unsigned int flags;
  int err;

  if (tcp->delayed_error)
    return tcp->delayed_error;

  flags = 0;
#if defined(__MVS__)
  /* on zOS the listen call does not bind automatically
     if the socket is unbound. Hence the manual binding to
     an arbitrary port is required to be done manually
  */
  flags |= UV_HANDLE_BOUND;
#endif
  err = maybe_new_socket(tcp, AF_INET, flags);
  if (err)
    return err;

  if (listen(tcp->io_watcher.fd, backlog))
    return UV__ERR(errno);

  tcp->connection_cb = cb;
  tcp->flags |= UV_HANDLE_BOUND;

  /* Start listening for connections. */
  tcp->io_watcher.cb = uv__server_io;
  uv__io_start(tcp->loop, &tcp->io_watcher, POLLIN);

  return 0;
}